

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

void __thiscall asmjit::CodeBuilder::removeNodes(CodeBuilder *this,CBNode *first,CBNode *last)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  void *pvVar3;
  CBNode *pCVar4;
  CBNode *pCVar5;
  CBNode **ppCVar6;
  bool bVar7;
  
  if (first == last) {
    removeNode(this,first);
    return;
  }
  pCVar1 = first->_prev;
  pCVar2 = last->_next;
  ppCVar6 = &pCVar1->_next;
  if (this->_firstNode == first) {
    ppCVar6 = &this->_firstNode;
  }
  *ppCVar6 = pCVar2;
  pCVar5 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != last) {
    pCVar5 = pCVar2;
  }
  pCVar5->_prev = pCVar1;
  do {
    pCVar2 = first->_next;
    if (pCVar2 == (CBNode *)0x0) {
LAB_0016375a:
      removeNodes();
    }
    first->_prev = (CBNode *)0x0;
    first->_next = (CBNode *)0x0;
    if (this->_cursor == first) {
      this->_cursor = pCVar1;
    }
    if (((first->_flags & 0x30) != 0) && (pvVar3 = first[1]._passData, pvVar3 != (void *)0x0)) {
      pCVar5 = (CBNode *)((long)pvVar3 + 0x30);
      while( true ) {
        pCVar4 = pCVar5->_prev;
        if (pCVar4 == (CBNode *)0x0) {
          removeNodes();
          goto LAB_0016375a;
        }
        if (pCVar4 == first) break;
        pCVar5 = pCVar4 + 2;
      }
      pCVar5->_prev = first[2]._prev;
      *(int *)((long)pvVar3 + 0x2c) = *(int *)((long)pvVar3 + 0x2c) + -1;
    }
    bVar7 = first == last;
    first = pCVar2;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void CodeBuilder::removeNodes(CBNode* first, CBNode* last) noexcept {
  if (first == last) {
    removeNode(first);
    return;
  }

  CBNode* prev = first->_prev;
  CBNode* next = last->_next;

  if (_firstNode == first)
    _firstNode = next;
  else
    prev->_next = next;

  if (_lastNode == last)
    _lastNode  = prev;
  else
    next->_prev = prev;

  CBNode* node = first;
  for (;;) {
    CBNode* next = node->getNext();
    ASMJIT_ASSERT(next != nullptr);

    node->_prev = nullptr;
    node->_next = nullptr;

    if (_cursor == node)
      _cursor = prev;
    CodeBuilder_nodeRemoved(this, node);

    if (node == last)
      break;
    node = next;
  }
}